

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetries.cc
# Opt level: O0

void gss::innards::find_symmetries
               (char *argv0,InputGraph *graph,
               list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *constraints,string *size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  void *this;
  ostream *this_00;
  char *pcVar6;
  istream *piVar7;
  ssize_t sVar8;
  size_type sVar9;
  reference pvVar10;
  char *in_RDX;
  path *in_RSI;
  size_type p;
  string arg;
  string word;
  bool found_size;
  int wstatus;
  ssize_t read_size;
  char buf [4096];
  stringstream output;
  int written;
  string line_to_write;
  pid_t child_pid;
  int stdout_pipefd [2];
  int stdin_pipefd [2];
  int m;
  int n;
  stringstream stdin_stream;
  string gap_helper_file_path_str;
  path gap_helper_file_path;
  path *in_stack_ffffffffffffe6e8;
  string *message;
  path *in_stack_ffffffffffffe6f0;
  path *in_stack_ffffffffffffe6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe708;
  undefined4 in_stack_ffffffffffffe710;
  int in_stack_ffffffffffffe714;
  path *in_stack_ffffffffffffe718;
  undefined4 in_stack_ffffffffffffe720;
  int in_stack_ffffffffffffe724;
  char *in_stack_ffffffffffffe728;
  char __c;
  path *in_stack_ffffffffffffe730;
  char *in_stack_ffffffffffffe738;
  InputGraph *in_stack_ffffffffffffe740;
  char (*in_stack_ffffffffffffe748) [24];
  path *in_stack_ffffffffffffe750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1600;
  string local_15e0 [39];
  byte local_15b9;
  int local_15b8;
  undefined1 local_15b2;
  ssize_t local_1590;
  undefined1 local_1588 [4104];
  stringstream local_580 [16];
  char local_570 [382];
  undefined1 local_3f2;
  int local_3cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a2;
  undefined1 local_37a;
  __pid_t local_358;
  undefined1 local_352;
  undefined1 local_32a;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  stringstream local_2f0 [16];
  ostream local_2e0 [414];
  undefined1 local_142;
  char *local_18;
  path *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffe750,(char **)in_stack_ffffffffffffe748,
             (format)((ulong)in_stack_ffffffffffffe740 >> 0x38));
  uVar4 = std::filesystem::__cxx11::path::has_filename();
  if ((uVar4 & 1) != 0) {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              (in_stack_ffffffffffffe750,(char (*) [4])in_stack_ffffffffffffe748,
               (format)((ulong)in_stack_ffffffffffffe740 >> 0x38));
    std::filesystem::__cxx11::operator/
              (in_stack_ffffffffffffe718,
               (path *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
              (in_stack_ffffffffffffe750,in_stack_ffffffffffffe748,
               (format)((ulong)in_stack_ffffffffffffe740 >> 0x38));
    std::filesystem::__cxx11::operator/
              (in_stack_ffffffffffffe718,
               (path *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    std::filesystem::__cxx11::path::operator=(in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f0);
    std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffe6f0);
    std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffe6f0);
    std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffe6f0);
    std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffe6f0);
    std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffe6f0);
  }
  bVar1 = std::filesystem::exists(in_stack_ffffffffffffe6f0);
  if (!bVar1) {
    local_142 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
    GapFailedUs::GapFailedUs
              ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
    local_142 = 0;
    __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  std::filesystem::__cxx11::path::operator_cast_to_string(in_stack_ffffffffffffe6e8);
  std::__cxx11::stringstream::stringstream(local_2f0);
  iVar2 = InputGraph::size((InputGraph *)0x1c2dab);
  this = (void *)std::ostream::operator<<(local_2e0,iVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_2f4 = 0; iVar2 = local_2f4, iVar3 = InputGraph::size((InputGraph *)0x1c2e0e),
      iVar2 < iVar3; local_2f4 = local_2f4 + 1) {
    iVar2 = InputGraph::degree(in_stack_ffffffffffffe740,
                               (int)((ulong)in_stack_ffffffffffffe738 >> 0x20));
    std::ostream::operator<<(local_2e0,iVar2);
    for (local_2f8 = 0; iVar2 = local_2f8, iVar3 = InputGraph::size((InputGraph *)0x1c2e96),
        iVar2 < iVar3; local_2f8 = local_2f8 + 1) {
      bVar1 = InputGraph::adjacent
                        ((InputGraph *)in_stack_ffffffffffffe700,
                         (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                         (int)in_stack_ffffffffffffe6f8);
      if (bVar1) {
        this_00 = std::operator<<(local_2e0," ");
        std::ostream::operator<<(this_00,local_2f8);
      }
    }
    std::ostream::operator<<(local_2e0,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = pipe2(&local_300,0x80000);
  if (iVar2 != 0) {
    local_32a = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
    GapFailedUs::GapFailedUs
              ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
    local_32a = 0;
    __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  iVar2 = pipe2(&local_308,0x80000);
  if (iVar2 != 0) {
    local_352 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
    GapFailedUs::GapFailedUs
              ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
    local_352 = 0;
    __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  local_358 = fork();
  if (local_358 == 0) {
    dup2(local_300,0);
    dup2(local_304,1);
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1c31f6);
    message = (string *)0x0;
    execlp("gap","gap","-q","-A","-b",pcVar6);
    local_37a = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
    GapFailedUs::GapFailedUs((GapFailedUs *)in_stack_ffffffffffffe6f0,message);
    local_37a = 0;
    __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  if (local_358 == -1) {
    local_3a2 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
    GapFailedUs::GapFailedUs
              ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
    local_3a2 = 0;
    __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  close(local_300);
  close(local_304);
  std::__cxx11::string::string(in_stack_ffffffffffffe700);
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_2f0,(string *)&local_3c8);
    bVar1 = std::ios::operator_cast_to_bool(piVar7 + *(long *)(*(long *)piVar7 + -0x18));
    if (!bVar1) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffe700,(char *)in_stack_ffffffffffffe6f8);
    while (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1c34b5), iVar2 = local_2fc, ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c34e3);
      sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(&local_3c8);
      sVar8 = write(iVar2,pcVar6,sVar9);
      local_3cc = (int)sVar8;
      if (local_3cc == -1) {
        local_3f2 = 1;
        uVar5 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720))
        ;
        GapFailedUs::GapFailedUs
                  ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname)
        ;
        local_3f2 = 0;
        __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_ffffffffffffe700,(size_type)in_stack_ffffffffffffe6f8,
                 (size_type)in_stack_ffffffffffffe6f0);
    }
  }
  close(local_2fc);
  std::__cxx11::stringstream::stringstream(local_580);
  while( true ) {
    local_1590 = read(local_308,local_1588,0x1000);
    if (local_1590 == -1) {
      local_15b2 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
      GapFailedUs::GapFailedUs
                ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
      local_15b2 = 0;
      __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    if (local_1590 == 0) break;
    std::ostream::write(local_570,(long)local_1588);
  }
  close(local_308);
  local_15b8 = 0;
  waitpid(local_358,&local_15b8,0);
  local_15b9 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe700);
  std::__cxx11::string::string(in_stack_ffffffffffffe700);
  while( true ) {
    while( true ) {
      piVar7 = std::operator>>((istream *)local_580,local_15e0);
      piVar7 = std::operator>>(piVar7,(string *)&local_1600);
      bVar1 = std::ios::operator_cast_to_bool(piVar7 + *(long *)(*(long *)piVar7 + -0x18));
      if (!bVar1) {
        if ((local_15b9 & 1) != 0) {
          std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
          std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
          std::__cxx11::stringstream::~stringstream(local_580);
          std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
          std::__cxx11::stringstream::~stringstream(local_2f0);
          std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
          std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffe6f0);
          return;
        }
        uVar5 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (&in_stack_ffffffffffffe730->_M_pathname,in_stack_ffffffffffffe728,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720))
        ;
        GapFailedUs::GapFailedUs
                  ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname)
        ;
        __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
      }
      bVar1 = std::operator==(&in_stack_ffffffffffffe6f0->_M_pathname,
                              (char *)in_stack_ffffffffffffe6e8);
      if (!bVar1) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&in_stack_ffffffffffffe6f0->_M_pathname,&in_stack_ffffffffffffe6e8->_M_pathname);
      local_15b9 = 1;
    }
    bVar1 = std::operator==(&in_stack_ffffffffffffe6f0->_M_pathname,
                            (char *)in_stack_ffffffffffffe6e8);
    __c = (char)((ulong)in_stack_ffffffffffffe728 >> 0x38);
    if (!bVar1) {
      uVar5 = __cxa_allocate_exception(0x28);
      std::operator+(in_stack_ffffffffffffe738,&in_stack_ffffffffffffe730->_M_pathname);
      std::operator+(&in_stack_ffffffffffffe6f8->_M_pathname,(char *)in_stack_ffffffffffffe6f0);
      GapFailedUs::GapFailedUs
                ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
      __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (&local_1600);
    if ((sVar9 < 3) ||
       (pvVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](&in_stack_ffffffffffffe6f0->_M_pathname,
                             (size_type)in_stack_ffffffffffffe6e8), *pvVar10 != '\'')) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
              (&local_1600);
    pvVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator[](&in_stack_ffffffffffffe6f0->_M_pathname,
                         (size_type)in_stack_ffffffffffffe6e8);
    if (*pvVar10 != '\'') break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_ffffffffffffe700,(size_type)in_stack_ffffffffffffe6f8,
               (size_type)in_stack_ffffffffffffe6f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
              (&local_1600);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_ffffffffffffe700,(size_type)in_stack_ffffffffffffe6f8,
               (size_type)in_stack_ffffffffffffe6f0);
    sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&in_stack_ffffffffffffe730->_M_pathname,__c,
                       CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
    if (sVar9 == 0xffffffffffffffff) {
      pcVar6 = (char *)__cxa_allocate_exception(0x28);
      std::operator+(pcVar6,&in_stack_ffffffffffffe730->_M_pathname);
      std::operator+(&in_stack_ffffffffffffe6f8->_M_pathname,(char *)in_stack_ffffffffffffe6f0);
      GapFailedUs::GapFailedUs
                ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
      __cxa_throw(pcVar6,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    in_stack_ffffffffffffe728 = local_18;
    in_stack_ffffffffffffe730 = local_10;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffe708,(size_type)in_stack_ffffffffffffe700,
               (size_type)in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe724 =
         std::__cxx11::stoi(&in_stack_ffffffffffffe6f0->_M_pathname,
                            (size_t *)in_stack_ffffffffffffe6e8,0);
    InputGraph::vertex_name_abi_cxx11_
              ((InputGraph *)in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
    in_stack_ffffffffffffe718 = local_10;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffe708,(size_type)in_stack_ffffffffffffe700,
               (size_type)in_stack_ffffffffffffe6f8);
    in_stack_ffffffffffffe714 =
         std::__cxx11::stoi(&in_stack_ffffffffffffe6f0->_M_pathname,
                            (size_t *)in_stack_ffffffffffffe6e8,0);
    InputGraph::vertex_name_abi_cxx11_
              ((InputGraph *)in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
    std::__cxx11::
    list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::__cxx11::string,std::__cxx11::string>
              ((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffe700,&in_stack_ffffffffffffe6f8->_M_pathname,
               &in_stack_ffffffffffffe6f0->_M_pathname);
    std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
    std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
    std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
    std::__cxx11::string::~string(&in_stack_ffffffffffffe6f0->_M_pathname);
  }
  uVar5 = __cxa_allocate_exception(0x28);
  std::operator+(in_stack_ffffffffffffe738,&in_stack_ffffffffffffe730->_M_pathname);
  std::operator+(&in_stack_ffffffffffffe6f8->_M_pathname,(char *)in_stack_ffffffffffffe6f0);
  GapFailedUs::GapFailedUs
            ((GapFailedUs *)in_stack_ffffffffffffe6f0,&in_stack_ffffffffffffe6e8->_M_pathname);
  __cxa_throw(uVar5,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
}

Assistant:

auto gss::innards::find_symmetries(
    const char * const argv0,
    const InputGraph & graph,
    std::list<std::pair<std::string, std::string>> & constraints,
    std::string & size) -> void
{
    path gap_helper_file_path = argv0;
    if (gap_helper_file_path.has_filename()) {
        gap_helper_file_path = gap_helper_file_path.parent_path() / "gap" / "findDPfactorsOfGraphs.g";
    }

    if (! exists(gap_helper_file_path))
        throw GapFailedUs{"couldn't find gap/findDPfactorsOfGraphs.g, which we need for symmetry detection"};

#if defined(STD_FS_IS_BOOST)
    string gap_helper_file_path_str = gap_helper_file_path.string();
#else
    string gap_helper_file_path_str = gap_helper_file_path;
#endif

    stringstream stdin_stream;
    stdin_stream << graph.size() << endl;
    for (int n = 0; n < graph.size(); ++n) {
        stdin_stream << graph.degree(n);
        for (int m = 0; m < graph.size(); ++m)
            if (graph.adjacent(n, m))
                stdin_stream << " " << m;
        stdin_stream << endl;
    }

    int stdin_pipefd[2], stdout_pipefd[2];

#ifdef __linux__
    if (0 != pipe2(stdin_pipefd, O_CLOEXEC))
        throw GapFailedUs{"couldn't make stdin pipes"};
    if (0 != pipe2(stdout_pipefd, O_CLOEXEC))
        throw GapFailedUs{"couldn't make stdout pipes"};
#else
    if (0 != pipe(stdin_pipefd))
        throw GapFailedUs{"couldn't make stdin pipes"};
    if (0 != pipe(stdout_pipefd))
        throw GapFailedUs{"couldn't make stdout pipes"};
    fcntl(stdin_pipefd[0], F_SETFD, FD_CLOEXEC);
    fcntl(stdin_pipefd[1], F_SETFD, FD_CLOEXEC);
    fcntl(stdout_pipefd[0], F_SETFD, FD_CLOEXEC);
    fcntl(stdout_pipefd[1], F_SETFD, FD_CLOEXEC);
#endif

    pid_t child_pid = fork();

    if (0 == child_pid) {
        dup2(stdin_pipefd[0], STDIN_FILENO);
        dup2(stdout_pipefd[1], STDOUT_FILENO);
        execlp("gap", "gap", "-q", "-A", "-b", gap_helper_file_path_str.c_str(), static_cast<char *>(nullptr));
        throw GapFailedUs{"exec gap failed"};
    }

    if (-1 == child_pid)
        throw GapFailedUs{"fork failed"};

    close(stdin_pipefd[0]);
    close(stdout_pipefd[1]);

    string line_to_write;
    while (getline(stdin_stream, line_to_write)) {
        line_to_write.append("\n");
        while (! line_to_write.empty()) {
            int written = write(stdin_pipefd[1], line_to_write.c_str(), line_to_write.length());
            if (-1 == written)
                throw GapFailedUs{"write failed"};
            line_to_write.erase(0, written);
        }
    }
    close(stdin_pipefd[1]);

    stringstream output;

    char buf[4096];
    ssize_t read_size;
    while (true) {
        read_size = read(stdout_pipefd[0], buf, 4096);
        if (-1 == read_size)
            throw GapFailedUs{"read failed"};
        else if (0 == read_size)
            break;
        output.write(buf, read_size);
    }

    close(stdout_pipefd[0]);

    int wstatus = 0;
    waitpid(child_pid, &wstatus, 0);
    bool found_size = 0;
    string word, arg;

    while (output >> word >> arg) {
        if (word == "--pattern-automorphism-group-size") {
            size = arg;
            found_size = true;
        }
        else if (word == "--pattern-less-than") {
            if (arg.length() < 3 || '\'' != arg[0] || '\'' != arg[arg.length() - 1])
                throw GapFailedUs{"can't parse pattern-less-than '" + arg + "': not quoted"};
            arg.erase(0, 1);
            arg.erase(arg.length() - 1);

            auto p = arg.find('<');
            if (p == string::npos)
                throw GapFailedUs{"can't parse pattern-less-than '" + arg + "': no less than"};
            constraints.emplace_back(graph.vertex_name(stoi(arg.substr(0, p))), graph.vertex_name(stoi(arg.substr(p + 1))));
        }
        else
            throw GapFailedUs{"unknown option '" + word + "'"};
    }

    if (! found_size)
        throw GapFailedUs{"parsing output failed"};
}